

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dense.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  int testCase;
  int local_c;
  
  std::istream::operator>>((istream *)&std::cin,&local_c);
  bVar1 = runCase(local_c);
  pcVar3 = "NO";
  if (bVar1) {
    pcVar3 = "YES!$@*";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main() {
    int testCase;
    cin>>testCase;
    if (runCase(testCase)) {
        cout<<"YES!$@*"<<endl;
    } else {
        cout<<"NO"<<endl;
    }
    return 0;
}